

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O2

shared_ptr<ut::setup_impl<agge::tests::DashTests>,_unsigned_int> __thiscall
ut::registry::get_setup<agge::tests::DashTests>(registry *this)

{
  iterator iVar1;
  uint *extraout_RDX;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_bool>
  pVar2;
  shared_ptr<ut::setup_impl<agge::tests::DashTests>,_unsigned_int> sVar3;
  shared_ptr<ut::destructible,_unsigned_int> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string id;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
  local_80;
  value_type local_50;
  
  agge::tests::DashTests::__suite_id_abi_cxx11_();
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                  *)(in_RSI + 0x48),&id);
  if (iVar1._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    std::__cxx11::string::string((string *)&local_c0,(string *)&id);
    local_d0._ptr = (destructible *)operator_new(0x38);
    (local_d0._ptr)->_vptr_destructible = (_func_int **)&PTR__setup_impl_001d49c0;
    local_d0._ptr[1]._vptr_destructible = (_func_int **)0x0;
    local_d0._ptr[2]._vptr_destructible = (_func_int **)0x0;
    local_d0._ptr[3]._vptr_destructible = (_func_int **)0x0;
    local_d0._ptr[4]._vptr_destructible = (_func_int **)0x0;
    local_d0._ptr[5]._vptr_destructible = (_func_int **)0x0;
    local_d0._ptr[6]._vptr_destructible = (_func_int **)0x0;
    local_d0._refcount = (uint *)operator_new(4);
    *local_d0._refcount = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
    ::pair(&local_80,&local_c0,&local_d0);
    std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>::
    pair<std::__cxx11::string,ut::shared_ptr<ut::destructible,unsigned_int>>
              ((pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>> *)
               &local_50,&local_80);
    pVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
            ::_M_insert_unique((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                                *)(in_RSI + 0x48),&local_50);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
    ::~pair(&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
    ::~pair(&local_80);
    shared_ptr<ut::destructible,_unsigned_int>::reset(&local_d0);
    std::__cxx11::string::_M_dispose();
  }
  static_pointer_cast<ut::setup_impl<agge::tests::DashTests>,ut::destructible,unsigned_int>
            ((shared_ptr<ut::destructible,_unsigned_int> *)(iVar1._M_node + 2));
  std::__cxx11::string::_M_dispose();
  sVar3._refcount = extraout_RDX;
  sVar3._ptr = (setup_impl<agge::tests::DashTests> *)this;
  return sVar3;
}

Assistant:

inline shared_ptr< setup_impl< FixtureT > > registry::get_setup()
	{
		typedef setup_impl<FixtureT> fixture_setup;

		const std::string id = FixtureT::__suite_id();
		_setups_map_t::const_iterator s = _setups.find(id);

		s = s == _setups.end() ?
			_setups.insert(std::make_pair(id, shared_ptr<destructible>(new fixture_setup))).first : s;
		return shared_ptr<fixture_setup>(static_pointer_cast< fixture_setup >(s->second));
	}